

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* unicode_regex_split(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *__return_storage_ptr__,string *text,
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *regex_exprs)

{
  pointer pbVar1;
  char cVar2;
  pointer pcVar3;
  unsigned_long uVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar5;
  bool bVar6;
  unicode_cpt_flags uVar7;
  unicode_cpt_flags uVar8;
  uint uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  int iVar12;
  long lVar13;
  _Base_ptr p_Var14;
  const_iterator cVar15;
  mapped_type_conflict1 *pmVar16;
  size_t sVar17;
  pointer puVar18;
  difference_type dVar19;
  difference_type dVar20;
  const_iterator cVar21;
  difference_type dVar22;
  difference_type dVar23;
  runtime_error *this;
  pointer puVar24;
  uint uVar25;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  pointer puVar26;
  pointer pbVar27;
  ulong uVar28;
  uint uVar29;
  pointer puVar30;
  wchar_t *__a;
  size_t i;
  pointer puVar31;
  pointer pbVar32;
  ulong uVar33;
  long lVar34;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *regex_expr;
  pointer pbVar35;
  pointer pbVar36;
  initializer_list<unsigned_long> __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  __l_00;
  initializer_list<std::pair<const_int,_int>_> __l_01;
  initializer_list<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bpe_words;
  wcmatch match;
  vector<unsigned_long,_std::allocator<unsigned_long>_> bpe_offsets;
  long local_220;
  size_t offset_end;
  pointer local_210;
  undefined1 local_208 [16];
  size_t _prev_end;
  wchar_t *pwStack_1f0;
  pointer local_1e8;
  wregex expr;
  vector<unsigned_long,_std::allocator<unsigned_long>_> tmp;
  anon_class_24_3_e618533c _get_flags;
  _Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  local_168;
  wchar_t *pwStack_150;
  vector<unsigned_int,_std::allocator<unsigned_int>_> cpts;
  string text_collapsed;
  vector<unsigned_int,_std::allocator<unsigned_int>_> cpts_1;
  undefined1 local_e8 [48];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_90;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_68;
  pointer local_40;
  pointer local_38;
  
  if ((unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
       ::k_ucat_enum_abi_cxx11_ == '\0') &&
     (iVar12 = __cxa_guard_acquire(&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                    ::k_ucat_enum_abi_cxx11_), iVar12 != 0)) {
    _get_flags.offset_ini = (size_t *)CONCAT44(_get_flags.offset_ini._4_4_,2);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::
    pair<const_char_(&)[6],_unicode_cpt_flags::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_unicode_h:8:5),_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                *)&cpts_1,(char (*) [6])"\\p{N}",(anon_enum_32 *)&_get_flags);
    expr._M_flags = 4;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::
    pair<const_char_(&)[6],_unicode_cpt_flags::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_unicode_h:8:5),_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                *)(local_e8 + 8),(char (*) [6])"\\p{L}",&expr._M_flags);
    match.
    super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(match.
                           super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                           .
                           super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,0x20);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::
    pair<const_char_(&)[6],_unicode_cpt_flags::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_unicode_h:8:5),_true>
              (&local_b8,(char (*) [6])"\\p{P}",(anon_enum_32 *)&match);
    text_collapsed._M_dataplus._M_p._0_4_ = 0x10;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::
    pair<const_char_(&)[6],_unicode_cpt_flags::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_unicode_h:8:5),_true>
              (&local_90,(char (*) [6])"\\p{M}",(anon_enum_32 *)&text_collapsed);
    bpe_words.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(bpe_words.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,0x40);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::
    pair<const_char_(&)[6],_unicode_cpt_flags::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_unicode_h:8:5),_true>
              (&local_68,(char (*) [6])"\\p{S}",(anon_enum_32 *)&bpe_words);
    __l_00._M_len = 5;
    __l_00._M_array = (iterator)&cpts_1;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::map(&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
           ::k_ucat_enum_abi_cxx11_,__l_00,
          (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          &offset_end,(allocator_type *)&cpts);
    lVar13 = 0xa0;
    do {
      std::__cxx11::string::~string
                ((string *)
                 ((long)&cpts_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar13));
      lVar13 = lVar13 + -0x28;
    } while (lVar13 != -0x28);
    __cxa_atexit(std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::~map,&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::k_ucat_enum_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::k_ucat_enum_abi_cxx11_);
  }
  if ((unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
       ::k_ucat_cpt == '\0') &&
     (iVar12 = __cxa_guard_acquire(&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                    ::k_ucat_cpt), iVar12 != 0)) {
    cpts_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0xd300000020;
    cpts_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0xd100000002;
    cpts_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xd200000004;
    local_e8._0_8_ = 0xd500000040;
    __l_01._M_len = 5;
    __l_01._M_array = (iterator)&cpts_1;
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
              (&unicode_regex_split::k_ucat_cpt,__l_01,(less<int> *)&_get_flags,
               (allocator_type *)&expr);
    __cxa_atexit(std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 ~map,&unicode_regex_split::k_ucat_cpt,&__dso_handle);
    __cxa_guard_release(&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::k_ucat_cpt);
  }
  if ((unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
       ::k_ucat_map_abi_cxx11_ == '\0') &&
     (iVar12 = __cxa_guard_acquire(&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                    ::k_ucat_map_abi_cxx11_), iVar12 != 0)) {
    _get_flags.offset_ini = (size_t *)CONCAT44(_get_flags.offset_ini._4_4_,2);
    std::
    pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<unicode_cpt_flags::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_unicode_h:8:5),_const_char_(&)[4],_true>
              ((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&cpts_1,(anon_enum_32 *)&_get_flags,(char (*) [4])"0-9");
    expr._M_flags = 4;
    std::
    pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<unicode_cpt_flags::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_unicode_h:8:5),_const_char_(&)[7],_true>
              ((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(local_e8 + 8),&expr._M_flags,(char (*) [7])"A-Za-z");
    match.
    super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(match.
                           super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                           .
                           super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,0x20);
    std::
    pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<unicode_cpt_flags::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_unicode_h:8:5),_const_char_(&)[26],_true>
              ((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_b8,(anon_enum_32 *)&match,(char (*) [26])"!-#%-*,-/:-;?-@\\[-\\]_\\{\\}");
    text_collapsed._M_dataplus._M_p._0_4_ = 0x10;
    std::
    pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<unicode_cpt_flags::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_unicode_h:8:5),_const_char_(&)[1],_true>
              ((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_90,(anon_enum_32 *)&text_collapsed,(char (*) [1])0x27482d);
    bpe_words.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(bpe_words.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,0x40);
    std::
    pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<unicode_cpt_flags::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_unicode_h:8:5),_const_char_(&)[12],_true>
              ((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_68,(anon_enum_32 *)&bpe_words,(char (*) [12])"\\$\\+<->^`\\|");
    __l_02._M_len = 5;
    __l_02._M_array = (iterator)&cpts_1;
    std::
    map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map(&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
           ::k_ucat_map_abi_cxx11_,__l_02,(less<int> *)&offset_end,(allocator_type *)&cpts);
    lVar13 = 0xa8;
    do {
      std::__cxx11::string::~string
                ((string *)
                 ((long)&cpts_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar13));
      lVar13 = lVar13 + -0x28;
    } while (lVar13 != -0x20);
    __cxa_atexit(std::
                 map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::~map,&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::k_ucat_map_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::k_ucat_map_abi_cxx11_);
  }
  pbVar32 = (regex_exprs->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  bVar6 = false;
  for (pbVar35 = (regex_exprs->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      p_Var14 = unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                ::k_ucat_enum_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
      pbVar35 != pbVar32; pbVar35 = pbVar35 + 1) {
    for (; (_Rb_tree_header *)p_Var14 !=
           &unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
            ::k_ucat_enum_abi_cxx11_._M_t._M_impl.super__Rb_tree_header;
        p_Var14 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var14)) {
      lVar13 = std::__cxx11::string::find((string *)pbVar35,(ulong)(p_Var14 + 1));
      if (lVar13 != -1) {
        bVar6 = true;
        break;
      }
    }
  }
  unicode_cpts_from_utf8(&cpts,text);
  text_collapsed._M_dataplus._M_p = (pointer)&text_collapsed.field_2;
  text_collapsed._M_string_length = 0;
  text_collapsed.field_2._M_local_buf[0] = '\0';
  puVar30 = (pointer)((long)cpts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)cpts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 2);
  if (bVar6) {
    std::__cxx11::string::resize((ulong)&text_collapsed);
    for (puVar31 = (pointer)0x0;
        puVar30 = (pointer)((long)cpts.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)cpts.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 2), puVar31 < puVar30;
        puVar31 = (pointer)((long)puVar31 + 1)) {
      uVar25 = cpts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[(long)puVar31];
      if (uVar25 < 0x80) {
        text_collapsed._M_dataplus._M_p[(long)puVar31] = (char)uVar25;
      }
      else {
        uVar7 = unicode_cpt_flags_from_cpt(uVar25);
        if (((ushort)uVar7 >> 8 & 1) == 0) {
          cpts_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(cpts_1.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,(uint)uVar7._0_1_);
          cVar15 = std::
                   _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                   ::find(&unicode_regex_split::k_ucat_cpt._M_t,(key_type *)&cpts_1);
          if ((_Rb_tree_header *)cVar15._M_node ==
              &unicode_regex_split::k_ucat_cpt._M_t._M_impl.super__Rb_tree_header) {
            text_collapsed._M_dataplus._M_p[(long)puVar31] = -0x30;
          }
          else {
            cpts_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(cpts_1.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,(uint)uVar7._0_1_)
            ;
            pmVar16 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                                (&unicode_regex_split::k_ucat_cpt,(key_type *)&cpts_1);
            text_collapsed._M_dataplus._M_p[(long)puVar31] = (char)*pmVar16;
          }
        }
        else {
          text_collapsed._M_dataplus._M_p[(long)puVar31] = '\v';
        }
      }
    }
  }
  __l._M_len = 1;
  __l._M_array = (iterator)&cpts_1;
  cpts_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = puVar30;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&bpe_offsets,__l,(allocator_type *)&_get_flags);
  pbVar35 = (regex_exprs->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_40 = (regex_exprs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pbVar35 == local_40) {
      bpe_words.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      bpe_words.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      bpe_words.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve(&bpe_words,
                (long)bpe_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)bpe_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3);
      uVar33 = 0;
      for (puVar18 = bpe_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          pbVar35 = bpe_words.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
          puVar18 !=
          bpe_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish; puVar18 = puVar18 + 1) {
        llama_vocab::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&bpe_words);
        for (uVar28 = uVar33; uVar4 = *puVar18, uVar28 < uVar4 + uVar33; uVar28 = uVar28 + 1) {
          unicode_cpt_to_utf8_abi_cxx11_
                    ((string *)&cpts_1,
                     cpts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar28]);
          std::__cxx11::string::append
                    ((string *)
                     (bpe_words.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish + -1));
          std::__cxx11::string::~string((string *)&cpts_1);
        }
        uVar33 = uVar4 + uVar33;
      }
      (__return_storage_ptr__->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      for (pbVar32 = bpe_words.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar32 != pbVar35;
          pbVar32 = pbVar32 + 1) {
        cpts_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&cpts_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        cpts_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        cpts_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((ulong)cpts_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage &
                      0xffffffffffffff00);
        unicode_cpts_from_utf8
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&match,pbVar32);
        uVar33 = 0;
        pvVar5 = _get_flags.cpts;
        while( true ) {
          puVar31 = cpts_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          puVar30 = cpts_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          _get_flags.cpts._4_4_ = (undefined4)((ulong)pvVar5 >> 0x20);
          _get_flags.cpts._0_4_ = (uint)pvVar5;
          if ((ulong)((long)match.
                            super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                            .
                            super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)match.
                            super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                            .
                            super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 2) <= uVar33) break;
          _get_flags.cpts = pvVar5;
          unicode_cpt_to_utf8_abi_cxx11_
                    ((string *)&_get_flags,
                     *(uint32_t *)
                      ((long)&((match.
                                super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                                .
                                super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super_pair<const_wchar_t_*,_const_wchar_t_*>).first + uVar33 * 4));
          std::__cxx11::string::append((string *)&cpts_1);
          std::__cxx11::string::~string((string *)&_get_flags);
          uVar33 = uVar33 + 1;
          pvVar5 = _get_flags.cpts;
        }
        _get_flags.offset_ini = (size_t *)&_get_flags.cpts;
        _get_flags.offset_end._0_4_ = 0;
        _get_flags.offset_end._4_4_ = 0;
        _get_flags.cpts._0_4_ = (uint)_get_flags.cpts & 0xffffff00;
        for (puVar26 = (pointer)0x0; puVar31 != puVar26; puVar26 = (pointer)((long)puVar26 + 1)) {
          unicode_byte_to_utf8_abi_cxx11_
                    ((string *)&expr,*(uint8_t *)((long)puVar30 + (long)puVar26));
          std::__cxx11::string::append((string *)&_get_flags);
          std::__cxx11::string::~string((string *)&expr);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,(string *)&_get_flags);
        std::__cxx11::string::~string((string *)&_get_flags);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&match);
        std::__cxx11::string::~string((string *)&cpts_1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&bpe_words);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&bpe_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::__cxx11::string::~string((string *)&text_collapsed);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&cpts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      return __return_storage_ptr__;
    }
    tmp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    tmp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    tmp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar6 = std::operator==(pbVar35,
                            "\'s|\'t|\'re|\'ve|\'m|\'ll|\'d| ?\\p{L}+| ?\\p{N}+| ?[^\\s\\p{L}\\p{N}]+|\\s+(?!\\S)"
                           );
    if (bVar6) {
      expr._M_flags = 0;
      expr._4_4_ = 0;
      expr._M_loc = (locale_type)0x0;
      expr._9_7_ = 0;
      expr._M_automaton.
      super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<wchar_t>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&expr,
                 (long)bpe_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)bpe_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3);
      unicode_cpts_from_utf8(&cpts_1,text);
      puVar18 = bpe_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      pbVar32 = (pointer)0x0;
      pvVar5 = _get_flags.cpts;
      for (puVar24 = bpe_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start; _get_flags.cpts = &cpts_1,
          puVar24 != puVar18; puVar24 = puVar24 + 1) {
        pbVar36 = (pointer)((long)&(pbVar32->_M_dataplus)._M_p + *puVar24);
        _get_flags.offset_ini = (size_t *)&bpe_words;
        _get_flags.offset_end = &offset_end;
        match.
        super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)&_prev_end;
        match.
        super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)&expr;
        bpe_words.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = pbVar32;
        offset_end = (size_t)pbVar36;
        _prev_end = (size_t)pbVar32;
LAB_002599e8:
        if (pbVar32 < offset_end) {
          uVar25 = 0xffffffff;
          if (bpe_words.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start <= pbVar32) {
            uVar25 = cpts_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)pbVar32];
          }
          uVar7 = unicode_regex_split_custom_gpt2::anon_class_24_3_e618533c::operator()
                            (&_get_flags,(size_t)pbVar32);
          uVar9 = (uint)(ushort)uVar7;
          if (uVar25 == 0x20) {
            uVar7 = unicode_regex_split_custom_gpt2::anon_class_24_3_e618533c::operator()
                              (&_get_flags,(size_t)((long)&(pbVar32->_M_dataplus)._M_p + 1));
            uVar9 = (uint)(ushort)uVar7;
            lVar13 = 1;
          }
          else if (uVar25 == 0x27) {
            pbVar27 = (pointer)((long)&(pbVar32->_M_dataplus)._M_p + 1);
            if (pbVar27 < offset_end) {
              uVar25 = 0xffffffff;
              if (pbVar27 < bpe_words.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) {
LAB_00259a52:
                pbVar27 = (pointer)((long)&(pbVar32->_M_dataplus)._M_p + 2);
                if (offset_end <= pbVar27) goto LAB_00259ac6;
                uVar29 = 0xffffffff;
                if (bpe_words.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start <= pbVar27) {
                  uVar29 = cpts_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start
                           [(long)((long)&(pbVar32->_M_dataplus)._M_p + 2)];
                }
                if (((uVar25 & 0xfffffffb) != 0x72) || (uVar29 != 0x65)) {
                  if (uVar25 != 0x6c) goto LAB_00259ac6;
                  lVar13 = 0;
                  if (uVar29 != 0x6c) goto LAB_00259ac8;
                }
                sVar17 = unicode_regex_split_custom_gpt2::anon_class_16_2_27270313::operator()
                                   ((anon_class_16_2_27270313 *)&match,
                                    (size_t)((long)&(pbVar32->_M_dataplus)._M_p + 3));
              }
              else {
                uVar25 = cpts_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start
                         [(long)((long)&(pbVar32->_M_dataplus)._M_p + 1)];
                if ((0x10 < uVar25 - 100) || ((0x18201U >> (uVar25 - 100 & 0x1f) & 1) == 0))
                goto LAB_00259a52;
                sVar17 = unicode_regex_split_custom_gpt2::anon_class_16_2_27270313::operator()
                                   ((anon_class_16_2_27270313 *)&match,
                                    (size_t)((long)&(pbVar32->_M_dataplus)._M_p + 2));
              }
              pbVar32 = (pointer)((long)&(pbVar32->_M_dataplus)._M_p + sVar17);
              goto LAB_002599e8;
            }
LAB_00259ac6:
            lVar13 = 0;
          }
          else {
            lVar13 = 0;
          }
LAB_00259ac8:
          if ((uVar9 & 4) == 0) {
            if ((uVar9 & 2) == 0) {
              if ((short)uVar9 == 0 || (uVar9 >> 8 & 1) != 0) {
                lVar13 = 0;
                pbVar27 = pbVar32;
                while( true ) {
                  uVar7 = unicode_regex_split_custom_gpt2::anon_class_24_3_e618533c::operator()
                                    (&_get_flags,(size_t)pbVar27);
                  if (((ushort)uVar7 >> 8 & 1) == 0) break;
                  pbVar27 = (pointer)((long)&(pbVar27->_M_dataplus)._M_p + 1);
                  lVar13 = lVar13 + -1;
                }
                if ((ulong)-lVar13 < 2) {
                  if (lVar13 == 0) {
                    pbVar32 = (pointer)((long)&(pbVar32->_M_dataplus)._M_p + 1);
                    unicode_regex_split_custom_gpt2::anon_class_16_2_27270313::operator()
                              ((anon_class_16_2_27270313 *)&match,(size_t)pbVar32);
                    goto LAB_002599e8;
                  }
                }
                else if (((bpe_words.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start <= pbVar27) &&
                         (pbVar27 < offset_end)) &&
                        (cpts_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start[(long)pbVar27] != 0xffffffff)) {
                  pbVar32 = (pointer)((long)&pbVar27[-1].field_2._M_allocated_capacity + 0xf);
                  unicode_regex_split_custom_gpt2::anon_class_16_2_27270313::operator()
                            ((anon_class_16_2_27270313 *)&match,(size_t)pbVar32);
                  goto LAB_002599e8;
                }
                unicode_regex_split_custom_gpt2::anon_class_16_2_27270313::operator()
                          ((anon_class_16_2_27270313 *)&match,(size_t)pbVar27);
                pbVar32 = pbVar27;
                goto LAB_002599e8;
              }
              pbVar32 = (pointer)((long)&(pbVar32->_M_dataplus)._M_p + lVar13);
              while (((short)uVar9 != 0 && ((uVar9 & 0x106) == 0))) {
                pbVar32 = (pointer)((long)&(pbVar32->_M_dataplus)._M_p + 1);
                uVar7 = unicode_regex_split_custom_gpt2::anon_class_24_3_e618533c::operator()
                                  (&_get_flags,(size_t)pbVar32);
                uVar9 = (uint)(ushort)uVar7;
              }
              unicode_regex_split_custom_gpt2::anon_class_16_2_27270313::operator()
                        ((anon_class_16_2_27270313 *)&match,(size_t)pbVar32);
            }
            else {
              pbVar32 = (pointer)((long)&(pbVar32->_M_dataplus)._M_p + lVar13);
              while ((uVar9 & 2) != 0) {
                pbVar32 = (pointer)((long)&(pbVar32->_M_dataplus)._M_p + 1);
                uVar7 = unicode_regex_split_custom_gpt2::anon_class_24_3_e618533c::operator()
                                  (&_get_flags,(size_t)pbVar32);
                uVar9 = (uint)(ushort)uVar7;
              }
              unicode_regex_split_custom_gpt2::anon_class_16_2_27270313::operator()
                        ((anon_class_16_2_27270313 *)&match,(size_t)pbVar32);
            }
          }
          else {
            pbVar32 = (pointer)((long)&(pbVar32->_M_dataplus)._M_p + lVar13);
            while ((uVar9 & 4) != 0) {
              pbVar32 = (pointer)((long)&(pbVar32->_M_dataplus)._M_p + 1);
              uVar7 = unicode_regex_split_custom_gpt2::anon_class_24_3_e618533c::operator()
                                (&_get_flags,(size_t)pbVar32);
              uVar9 = (uint)(ushort)uVar7;
            }
            unicode_regex_split_custom_gpt2::anon_class_16_2_27270313::operator()
                      ((anon_class_16_2_27270313 *)&match,(size_t)pbVar32);
          }
          goto LAB_002599e8;
        }
        pbVar32 = pbVar36;
        pvVar5 = _get_flags.cpts;
      }
LAB_0025a0da:
      _get_flags.cpts = pvVar5;
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&cpts_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(&tmp,&expr);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&expr);
    }
    else {
      bVar6 = std::operator==(pbVar35,
                              "(?i:\'s|\'t|\'re|\'ve|\'m|\'ll|\'d)|[^\\r\\n\\p{L}\\p{N}]?\\p{L}+|\\p{N}{1,3}| ?[^\\s\\p{L}\\p{N}]+[\\r\\n]*|\\s*[\\r\\n]+|\\s+(?!\\S)|\\s+"
                             );
      if (bVar6) {
LAB_00259c85:
        expr._M_flags = 0;
        expr._4_4_ = 0;
        expr._M_loc = (locale_type)0x0;
        expr._9_7_ = 0;
        expr._M_automaton.
        super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<wchar_t>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&expr,
                   (long)bpe_offsets.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)bpe_offsets.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3);
        unicode_cpts_from_utf8(&cpts_1,text);
        local_38 = bpe_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        pbVar32 = (pointer)0x0;
        pvVar5 = _get_flags.cpts;
        for (puVar18 = bpe_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                       ._M_impl.super__Vector_impl_data._M_start; _get_flags.cpts = &cpts_1,
            puVar18 != local_38; puVar18 = puVar18 + 1) {
          pbVar36 = (pointer)((long)&(pbVar32->_M_dataplus)._M_p + *puVar18);
          _get_flags.offset_ini = (size_t *)&bpe_words;
          _get_flags.offset_end = &offset_end;
          match.
          super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)&_prev_end;
          match.
          super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)&expr;
          bpe_words.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = pbVar32;
          offset_end = (size_t)pbVar36;
          _prev_end = (size_t)pbVar32;
LAB_00259d4d:
          if (pbVar32 < offset_end) {
            uVar25 = 0xffffffff;
            if (bpe_words.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start <= pbVar32) {
              uVar25 = cpts_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start[(long)pbVar32];
            }
            uVar7 = unicode_regex_split_custom_llama3::anon_class_24_3_e618533c::operator()
                              ((anon_class_24_3_e618533c *)&_get_flags,(size_t)pbVar32);
            sVar17 = offset_end;
            pbVar27 = bpe_words.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((uVar25 != 10) && (uVar25 != 0xd)) {
              if ((uVar25 == 0x27) &&
                 (pbVar1 = (pointer)((long)&(pbVar32->_M_dataplus)._M_p + 1), pbVar1 < offset_end))
              {
                uVar10 = 0xffffffff;
                if (bpe_words.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start <= pbVar1) {
                  uVar10 = cpts_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start
                           [(long)((long)&(pbVar32->_M_dataplus)._M_p + 1)];
                }
                uVar10 = unicode_tolower(uVar10);
                if ((uVar10 - 100 < 0x11) && ((0x18201U >> (uVar10 - 100 & 0x1f) & 1) != 0)) {
                  sVar17 = unicode_regex_split_custom_llama3::anon_class_16_2_27270313::operator()
                                     ((anon_class_16_2_27270313 *)&match,
                                      (size_t)((long)&(pbVar32->_M_dataplus)._M_p + 2));
LAB_00259def:
                  pbVar32 = (pointer)((long)&(pbVar32->_M_dataplus)._M_p + sVar17);
                  goto LAB_00259d4d;
                }
                pbVar1 = (pointer)((long)&(pbVar32->_M_dataplus)._M_p + 2);
                if (pbVar1 < sVar17) {
                  uVar11 = 0xffffffff;
                  if (pbVar27 <= pbVar1) {
                    uVar11 = cpts_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                             _M_impl.super__Vector_impl_data._M_start
                             [(long)((long)&(pbVar32->_M_dataplus)._M_p + 2)];
                  }
                  uVar11 = unicode_tolower(uVar11);
                  if ((((uVar10 & 0xfffffffb) == 0x72) && (uVar11 == 0x65)) ||
                     ((uVar10 == 0x6c && (uVar11 == 0x6c)))) {
                    sVar17 = unicode_regex_split_custom_llama3::anon_class_16_2_27270313::operator()
                                       ((anon_class_16_2_27270313 *)&match,
                                        (size_t)((long)&(pbVar32->_M_dataplus)._M_p + 3));
                    goto LAB_00259def;
                  }
                }
              }
              if (((ushort)uVar7 & 2) == 0) {
                if (((ushort)uVar7 & 4) == 0) {
                  uVar8 = unicode_regex_split_custom_llama3::anon_class_24_3_e618533c::operator()
                                    ((anon_class_24_3_e618533c *)&_get_flags,
                                     (size_t)((long)&(pbVar32->_M_dataplus)._M_p + 1));
                  if (((ushort)uVar8 & 4) == 0) goto LAB_00259e7e;
                }
                do {
                  pbVar32 = (pointer)((long)&(pbVar32->_M_dataplus)._M_p + 1);
                  uVar7 = unicode_regex_split_custom_llama3::anon_class_24_3_e618533c::operator()
                                    ((anon_class_24_3_e618533c *)&_get_flags,(size_t)pbVar32);
                } while (((ushort)uVar7 & 4) != 0);
                unicode_regex_split_custom_llama3::anon_class_16_2_27270313::operator()
                          ((anon_class_16_2_27270313 *)&match,(size_t)pbVar32);
                goto LAB_00259d4d;
              }
            }
LAB_00259e7e:
            if (((ushort)uVar7 & 2) != 0) {
              do {
                uVar33 = 0;
                do {
                  pbVar27 = (pointer)((long)&(pbVar32->_M_dataplus)._M_p + uVar33);
                  uVar7 = unicode_regex_split_custom_llama3::anon_class_24_3_e618533c::operator()
                                    ((anon_class_24_3_e618533c *)&_get_flags,(size_t)pbVar27);
                  if (((ushort)uVar7 & 2) == 0) {
                    unicode_regex_split_custom_llama3::anon_class_16_2_27270313::operator()
                              ((anon_class_16_2_27270313 *)&match,(size_t)pbVar27);
                    pbVar32 = pbVar27;
                    goto LAB_00259d4d;
                  }
                  uVar33 = uVar33 + 1;
                } while (uVar33 < 3);
                pbVar32 = (pointer)((long)&(pbVar32->_M_dataplus)._M_p + uVar33);
                unicode_regex_split_custom_llama3::anon_class_16_2_27270313::operator()
                          ((anon_class_16_2_27270313 *)&match,(size_t)pbVar32);
              } while( true );
            }
            uVar8 = uVar7;
            if (uVar25 == 0x20) {
              uVar8 = unicode_regex_split_custom_llama3::anon_class_24_3_e618533c::operator()
                                ((anon_class_24_3_e618533c *)&_get_flags,
                                 (size_t)((long)&(pbVar32->_M_dataplus)._M_p + 1));
            }
            if (uVar7 != (unicode_cpt_flags)0x0 && ((ushort)uVar8 & 0x106) == 0) {
              pbVar32 = (pointer)((long)&(pbVar32->_M_dataplus)._M_p + (ulong)(uVar25 == 0x20));
              while ((uVar8 != (unicode_cpt_flags)0x0 && (((ushort)uVar8 & 0x106) == 0))) {
                pbVar32 = (pointer)((long)&(pbVar32->_M_dataplus)._M_p + 1);
                uVar8 = unicode_regex_split_custom_llama3::anon_class_24_3_e618533c::operator()
                                  ((anon_class_24_3_e618533c *)&_get_flags,(size_t)pbVar32);
              }
              uVar25 = 0xffffffff;
              if (offset_end <= pbVar32 ||
                  pbVar32 < bpe_words.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) goto LAB_0025a087;
              do {
                uVar25 = cpts_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start[(long)pbVar32];
LAB_0025a087:
                do {
                  if ((uVar25 != 0xd) && (uVar25 != 10)) {
                    unicode_regex_split_custom_llama3::anon_class_16_2_27270313::operator()
                              ((anon_class_16_2_27270313 *)&match,(size_t)pbVar32);
                    goto LAB_00259d4d;
                  }
                  pbVar32 = (pointer)((long)&(pbVar32->_M_dataplus)._M_p + 1);
                  uVar25 = 0xffffffff;
                } while (pbVar32 < bpe_words.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start ||
                         offset_end <= pbVar32);
              } while( true );
            }
            uVar33 = 0;
            pbVar27 = (pointer)0x0;
            while( true ) {
              pbVar1 = (pointer)((long)&(pbVar32->_M_dataplus)._M_p + uVar33);
              uVar7 = unicode_regex_split_custom_llama3::anon_class_24_3_e618533c::operator()
                                ((anon_class_24_3_e618533c *)&_get_flags,(size_t)pbVar1);
              if (((ushort)uVar7 >> 8 & 1) == 0) break;
              if (((bpe_words.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start <= pbVar1) && (pbVar1 < offset_end))
                 && ((cpts_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                      .super__Vector_impl_data._M_start[(long)&(pbVar32->_M_dataplus)._M_p + uVar33]
                      == 0xd ||
                     (cpts_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                      .super__Vector_impl_data._M_start[(long)&(pbVar32->_M_dataplus)._M_p + uVar33]
                      == 10)))) {
                pbVar27 = (pointer)((long)&(pbVar32->_M_dataplus)._M_p + uVar33 + 1);
              }
              uVar33 = uVar33 + 1;
            }
            if (pbVar27 != (pointer)0x0) {
              unicode_regex_split_custom_llama3::anon_class_16_2_27270313::operator()
                        ((anon_class_16_2_27270313 *)&match,(size_t)pbVar27);
              pbVar32 = pbVar27;
              goto LAB_00259d4d;
            }
            if (uVar33 < 2) {
              if (uVar33 == 0) {
                pbVar32 = (pointer)((long)&(pbVar32->_M_dataplus)._M_p + 1);
                unicode_regex_split_custom_llama3::anon_class_16_2_27270313::operator()
                          ((anon_class_16_2_27270313 *)&match,(size_t)pbVar32);
                goto LAB_00259d4d;
              }
            }
            else if (((bpe_words.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start <= pbVar1) && (pbVar1 < offset_end)
                     ) && (cpts_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start
                           [(long)&(pbVar32->_M_dataplus)._M_p + uVar33] != 0xffffffff)) {
              pbVar32 = (pointer)((long)pbVar32 + (uVar33 - 1));
              unicode_regex_split_custom_llama3::anon_class_16_2_27270313::operator()
                        ((anon_class_16_2_27270313 *)&match,(size_t)pbVar32);
              goto LAB_00259d4d;
            }
            unicode_regex_split_custom_llama3::anon_class_16_2_27270313::operator()
                      ((anon_class_16_2_27270313 *)&match,(size_t)pbVar1);
            pbVar32 = pbVar1;
            goto LAB_00259d4d;
          }
          pbVar32 = pbVar36;
          pvVar5 = _get_flags.cpts;
        }
        goto LAB_0025a0da;
      }
      bVar6 = std::operator==(pbVar35,
                              "(?:\'[sS]|\'[tT]|\'[rR][eE]|\'[vV][eE]|\'[mM]|\'[lL][lL]|\'[dD])|[^\\r\\n\\p{L}\\p{N}]?\\p{L}+|\\p{N}{1,3}| ?[^\\s\\p{L}\\p{N}]+[\\r\\n]*|\\s*[\\r\\n]+|\\s+(?!\\S)|\\s+"
                             );
      if (bVar6) goto LAB_00259c85;
    }
    p_Var14 = unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
              ::k_ucat_enum_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (tmp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        tmp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
LAB_0025a135:
      if ((_Rb_tree_header *)p_Var14 ==
          &unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
           ::k_ucat_enum_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
        std::__cxx11::
        wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
        ::wstring_convert((wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
                           *)&cpts_1);
        std::__cxx11::
        wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
        ::from_bytes((wide_string *)&bpe_words,
                     (wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
                      *)&cpts_1,pbVar35);
        std::__cxx11::
        wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
        ::~wstring_convert((wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
                            *)&cpts_1);
        offset_end = (size_t)local_208;
        std::__cxx11::wstring::
        _M_construct<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  ((wstring *)&offset_end,
                   cpts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   cpts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        for (puVar30 = (pointer)0x0; puVar30 < local_210; puVar30 = (pointer)((long)puVar30 + 1)) {
          uVar10 = *(uint32_t *)(offset_end + (long)puVar30 * 4);
          if (0x7f < (int)uVar10) {
            uVar7 = unicode_cpt_flags_from_cpt(uVar10);
            if (((ushort)uVar7 >> 8 & 1) != 0) {
              *(undefined4 *)(offset_end + (long)puVar30 * 4) = 0xb;
            }
          }
        }
        std::__cxx11::basic_regex<wchar_t,std::__cxx11::regex_traits<wchar_t>>::
        basic_regex<std::char_traits<wchar_t>,std::allocator<wchar_t>>
                  ((basic_regex<wchar_t,std::__cxx11::regex_traits<wchar_t>> *)&expr,
                   (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                   &bpe_words,0x10);
        _prev_end = 0;
        pwStack_1f0 = (wchar_t *)0x0;
        local_1e8 = (pointer)0x0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&_prev_end,
                   (long)bpe_offsets.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)bpe_offsets.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3);
        puVar18 = bpe_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        lVar13 = 0;
        for (puVar24 = bpe_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                       ._M_impl.super__Vector_impl_data._M_start; puVar24 != puVar18;
            puVar24 = puVar24 + 1) {
          uVar4 = *puVar24;
          __a = (wchar_t *)(lVar13 * 4 + offset_end);
          std::__cxx11::
          regex_iterator<const_wchar_t_*,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>::
          regex_iterator((regex_iterator<const_wchar_t_*,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>
                          *)&cpts_1,__a,__a + uVar4,&expr,0);
          local_168._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pwStack_150 = (wchar_t *)0x0;
          local_168._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_168._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          _get_flags.cpts._0_4_ = 0;
          _get_flags.cpts._4_4_ = 0;
          _get_flags.offset_ini = (size_t *)0x0;
          _get_flags.offset_end._0_4_ = 0;
          _get_flags.offset_end._4_4_ = 0;
          lVar34 = 0;
          while( true ) {
            bVar6 = std::__cxx11::
                    regex_iterator<const_wchar_t_*,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>::
                    operator!=((regex_iterator<const_wchar_t_*,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>
                                *)&cpts_1,
                               (regex_iterator<const_wchar_t_*,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>
                                *)&_get_flags);
            if (!bVar6) break;
            std::__cxx11::
            match_results<const_wchar_t_*,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
            ::match_results(&match,(match_results<const_wchar_t_*,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                                    *)local_e8);
            dVar19 = std::__cxx11::
                     match_results<const_wchar_t_*,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                     ::position(&match,0);
            if (lVar34 < dVar19) {
              dVar19 = std::__cxx11::
                       match_results<const_wchar_t_*,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                       ::position(&match,0);
              local_220 = dVar19 - lVar34;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<long>
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&_prev_end,
                         &local_220);
            }
            local_220 = std::__cxx11::
                        match_results<const_wchar_t_*,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                        ::length(&match,0);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<long>
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&_prev_end,
                       &local_220);
            dVar19 = std::__cxx11::
                     match_results<const_wchar_t_*,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                     ::position(&match,0);
            dVar20 = std::__cxx11::
                     match_results<const_wchar_t_*,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                     ::length(&match,0);
            std::__cxx11::
            regex_iterator<const_wchar_t_*,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>::
            operator++((regex_iterator<const_wchar_t_*,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>
                        *)&cpts_1);
            lVar34 = dVar20 + dVar19;
            std::
            _Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
            ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                             *)&match);
          }
          if ((pointer)(uVar4 - lVar34) != (pointer)0x0 && lVar34 <= (long)uVar4) {
            match.
            super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)(uVar4 - lVar34);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&_prev_end,
                       (unsigned_long *)&match);
          }
          lVar13 = lVar13 + uVar4;
          std::
          _Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
          ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                           *)&local_168);
          std::
          _Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
          ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                           *)local_e8);
        }
        std::__cxx11::basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_>::~basic_regex
                  (&expr);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
                  (&bpe_offsets,
                   (_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&_prev_end);
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&_prev_end);
        std::__cxx11::wstring::~wstring((wstring *)&offset_end);
        std::__cxx11::wstring::~wstring((wstring *)&bpe_words);
      }
      else {
        lVar13 = std::__cxx11::string::find((string *)pbVar35,(ulong)(p_Var14 + 1));
        if (lVar13 == -1) break;
        unicode_cpts_from_utf8
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&offset_end,pbVar35);
        lVar13 = 0;
        while ((long)((long)local_210 - offset_end) >> 2 != lVar13) {
          lVar34 = lVar13 * 4;
          lVar13 = lVar13 + 1;
          if (0x7f < *(uint *)(offset_end + lVar34)) {
            this = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error
                      (this,
                       "Regex includes both unicode categories and non-ASCII characters - not supported"
                      );
            __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        bpe_words.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&bpe_words.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        bpe_words.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        bpe_words.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)((ulong)bpe_words.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage &
                      0xffffffffffffff00);
        bVar6 = false;
        for (uVar33 = 0; uVar33 < pbVar35->_M_string_length; uVar33 = uVar33 + 1) {
          pcVar3 = (pbVar35->_M_dataplus)._M_p;
          cVar2 = pcVar3[uVar33];
          if (cVar2 == '[') {
            if ((uVar33 != 0) && (pcVar3[uVar33 - 1] == '\\')) goto LAB_0025a5e7;
            bVar6 = true;
            std::__cxx11::string::push_back((char)&bpe_words);
          }
          else {
            if ((bool)(~bVar6 | cVar2 != ']')) {
              if (((cVar2 == '\\') && (uVar28 = uVar33 + 4, uVar28 < pbVar35->_M_string_length)) &&
                 ((pcVar3[uVar33 + 1] == 'p' &&
                  ((pcVar3[uVar33 + 2] == '{' && (pcVar3[uVar28] == '}')))))) {
                std::__cxx11::string::substr((ulong)&cpts_1,(ulong)pbVar35);
                cVar21 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         ::find(&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                 ::k_ucat_enum_abi_cxx11_._M_t,(key_type *)&cpts_1);
                if ((_Rb_tree_header *)cVar21._M_node !=
                    &unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                     ::k_ucat_enum_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
                  if (!bVar6) {
                    std::__cxx11::string::push_back((char)&bpe_words);
                  }
                  pmVar16 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                            ::at(&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                  ::k_ucat_enum_abi_cxx11_,(key_type *)&cpts_1);
                  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  at(&unicode_regex_split::k_ucat_cpt,pmVar16);
                  std::__cxx11::string::push_back((char)&bpe_words);
                  pmVar16 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                            ::at(&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                  ::k_ucat_enum_abi_cxx11_,(key_type *)&cpts_1);
                  std::
                  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::at(&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                        ::k_ucat_map_abi_cxx11_,pmVar16);
                  std::__cxx11::string::append((string *)&bpe_words);
                  uVar33 = uVar28;
                  if (!bVar6) {
                    std::__cxx11::string::push_back((char)&bpe_words);
                  }
                }
                std::__cxx11::string::~string((string *)&cpts_1);
                if ((_Rb_tree_header *)cVar21._M_node !=
                    &unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                     ::k_ucat_enum_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) goto LAB_0025a5f4;
              }
            }
            else if (pcVar3[uVar33 - 1] != '\\') {
              std::__cxx11::string::push_back((char)&bpe_words);
              bVar6 = false;
              goto LAB_0025a5f4;
            }
LAB_0025a5e7:
            std::__cxx11::string::push_back((char)&bpe_words);
          }
LAB_0025a5f4:
        }
        std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
        basic_regex<std::char_traits<char>,std::allocator<char>>
                  ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&expr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bpe_words,
                   0x10);
        _prev_end = 0;
        pwStack_1f0 = (wchar_t *)0x0;
        local_1e8 = (pointer)0x0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&_prev_end,
                   (long)bpe_offsets.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)bpe_offsets.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3);
        puVar18 = bpe_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        lVar13 = 0;
        for (puVar24 = bpe_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                       ._M_impl.super__Vector_impl_data._M_start; puVar24 != puVar18;
            puVar24 = puVar24 + 1) {
          uVar4 = *puVar24;
          std::__cxx11::regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
          regex_iterator((regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> *)
                         &cpts_1,text_collapsed._M_dataplus._M_p + lVar13,
                         text_collapsed._M_dataplus._M_p + lVar13 + uVar4,(regex_type *)&expr,0);
          local_168._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pwStack_150 = (wchar_t *)0x0;
          local_168._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_168._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          _get_flags.cpts._0_4_ = 0;
          _get_flags.cpts._4_4_ = 0;
          _get_flags.offset_ini = (size_t *)0x0;
          _get_flags.offset_end._0_4_ = 0;
          _get_flags.offset_end._4_4_ = 0;
          lVar34 = 0;
          while( true ) {
            bVar6 = std::__cxx11::
                    regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
                    operator!=((regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>
                                *)&cpts_1,
                               (regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>
                                *)&_get_flags);
            if (!bVar6) break;
            std::__cxx11::
            match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
            match_results((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                           *)&match,
                          (match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                           *)local_e8);
            dVar22 = std::__cxx11::
                     match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                     ::position((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                 *)&match,0);
            if (lVar34 < dVar22) {
              local_220 = std::__cxx11::
                          match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ::position((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                      *)&match,0);
              local_220 = local_220 - lVar34;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<long>
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&_prev_end,
                         &local_220);
            }
            local_220 = std::__cxx11::
                        match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        ::length((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                  *)&match,0);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<long>
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&_prev_end,
                       &local_220);
            dVar22 = std::__cxx11::
                     match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                     ::position((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                 *)&match,0);
            dVar23 = std::__cxx11::
                     match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                     ::length((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                               *)&match,0);
            std::__cxx11::regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
            operator++((regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> *)
                       &cpts_1);
            lVar34 = dVar23 + dVar22;
            std::
            _Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
            ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             *)&match);
          }
          if ((pointer)(uVar4 - lVar34) != (pointer)0x0 && lVar34 <= (long)uVar4) {
            match.
            super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)(uVar4 - lVar34);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&_prev_end,
                       (unsigned_long *)&match);
          }
          lVar13 = lVar13 + uVar4;
          std::
          _Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ::~_Vector_base(&local_168);
          std::
          _Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                           *)local_e8);
        }
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&expr);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
                  (&bpe_offsets,
                   (_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&_prev_end);
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&_prev_end);
        std::__cxx11::string::~string((string *)&bpe_words);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&offset_end);
      }
      goto LAB_0025a7fd;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(&bpe_offsets,&tmp);
LAB_0025a7fd:
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&tmp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    pbVar35 = pbVar35 + 1;
  } while( true );
  p_Var14 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var14);
  goto LAB_0025a135;
}

Assistant:

std::vector<std::string> unicode_regex_split(const std::string & text, const std::vector<std::string> & regex_exprs) {
    // unicode categories
    static const std::map<std::string, int> k_ucat_enum = {
        { "\\p{N}", unicode_cpt_flags::NUMBER },
        { "\\p{L}", unicode_cpt_flags::LETTER },
        { "\\p{P}", unicode_cpt_flags::PUNCTUATION },
        { "\\p{M}", unicode_cpt_flags::ACCENT_MARK },
        { "\\p{S}", unicode_cpt_flags::SYMBOL },
    };

    static const std::map<int, int> k_ucat_cpt = {
        { unicode_cpt_flags::NUMBER,      0xD1 },
        { unicode_cpt_flags::LETTER,      0xD2 },
        { unicode_cpt_flags::PUNCTUATION, 0xD3 },
        { unicode_cpt_flags::ACCENT_MARK, 0xD4 },
        { unicode_cpt_flags::SYMBOL,      0xD5 },
    };

    static const std::map<int, std::string> k_ucat_map = {
        { unicode_cpt_flags::NUMBER,      "\x30-\x39" }, // 0-9
        { unicode_cpt_flags::LETTER,      "\x41-\x5A\x61-\x7A" }, // A-Za-z
        { unicode_cpt_flags::PUNCTUATION, "\x21-\x23\x25-\x2A\x2C-\x2F\x3A-\x3B\x3F-\x40\\\x5B-\\\x5D\x5F\\\x7B\\\x7D" }, // !-#%-*,-/:-;?-@\[-\]_\{\}
        { unicode_cpt_flags::ACCENT_MARK, "" }, // no sub-128 codepoints
        { unicode_cpt_flags::SYMBOL,      "\\\x24\\\x2B\x3C-\x3E\x5E\x60\\\x7C" }, // $+<=>^`|
    };

    // compute collapsed codepoints only if needed by at least one regex
    bool need_collapse = false;
    for (const auto & regex_expr : regex_exprs) {
        // search for unicode categories
        for (const auto & ucat : k_ucat_enum) {
            if (std::string::npos != regex_expr.find(ucat.first)) {
                need_collapse = true;
                break;
            }
        }
    }

    const auto cpts = unicode_cpts_from_utf8(text);

    // generate a "collapsed" representation of the text, where all codepoints are replaced by a single byte
    // ref: https://github.com/ggml-org/llama.cpp/pull/6920#issuecomment-2081479935
    std::string text_collapsed;
    if (need_collapse) {
        // collapse all unicode categories
        text_collapsed.resize(cpts.size());

        for (size_t i = 0; i < cpts.size(); ++i) {
            // keep single-byte codepoints as is
            if (cpts[i] < 128) {
                text_collapsed[i] = cpts[i];
                continue;
            }

            const auto flags = unicode_cpt_flags_from_cpt(cpts[i]);

            if (flags.is_whitespace) {
                //NOTE: C++ std::regex \s does not mach 0x85, Rust and Python regex does.
                //text_collapsed[i] = (char) 0x85;  // <Next Line> as whitespace fallback
                text_collapsed[i] = (char) 0x0B;    // <vertical tab> as whitespace fallback
            } else if (k_ucat_cpt.find(flags.category_flag()) != k_ucat_cpt.end()) {
                text_collapsed[i] = k_ucat_cpt.at(flags.category_flag());
            } else {
                text_collapsed[i] = (char) 0xD0; // fallback
            }
        }
    }

    std::vector<size_t> bpe_offsets = { cpts.size() };

    for (const auto & regex_expr : regex_exprs) {
        // first, see if we have an efficient custom regex implementation
        auto tmp = unicode_regex_split_custom(text, regex_expr, bpe_offsets);

        if (!tmp.empty()) {
            bpe_offsets = std::move(tmp);
            continue;
        }

        // fallback to general-purpose std::regex / std::wregex
        try {
            // if a unicode category is used in the regex, we use the collapsed text and replace the unicode category
            // with the corresponding collapsed representation
            bool use_collapsed = false;
            for (const auto & ucat : k_ucat_enum) {
                if (std::string::npos != regex_expr.find(ucat.first)) {
                    use_collapsed = true;
                    break;
                }
            }

            if (use_collapsed) {
                // sanity-check that the original regex does not contain any non-ASCII characters
                const auto cpts_regex = unicode_cpts_from_utf8(regex_expr);
                for (size_t i = 0; i < cpts_regex.size(); ++i) {
                    if (cpts_regex[i] >= 128) {
                        throw std::runtime_error("Regex includes both unicode categories and non-ASCII characters - not supported");
                    }
                }

                // generate a collapsed representation of the regex
                std::string regex_expr_collapsed;

                // track if we are inside [], because nested [] are not allowed
                bool inside = false;
                for (size_t i = 0; i < regex_expr.size(); ++i) {
                    if (regex_expr[i] == '[' && (i == 0 || regex_expr[i - 1] != '\\')) {
                        regex_expr_collapsed += '[';
                        inside = true;
                        continue;
                    }

                    if (inside && regex_expr[i] == ']' && regex_expr[i - 1] != '\\') {
                        regex_expr_collapsed += ']';
                        inside = false;
                        continue;
                    }

                    if (regex_expr[i + 0] == '\\' && i + 4 < regex_expr.size() &&
                        regex_expr[i + 1] == 'p' &&
                        regex_expr[i + 2] == '{' &&
                        regex_expr[i + 4] == '}') {
                        const std::string pat = regex_expr.substr(i, 5);
                        if (k_ucat_enum.find(pat) != k_ucat_enum.end()) {
                            if (!inside) {
                                regex_expr_collapsed += '[';
                            }
                            regex_expr_collapsed += k_ucat_cpt.at(k_ucat_enum.at(pat));
                            regex_expr_collapsed += k_ucat_map.at(k_ucat_enum.at(pat));
                            if (!inside) {
                                regex_expr_collapsed += ']';
                            }
                            i += 4;
                            continue;
                        }
                    }

                    regex_expr_collapsed += regex_expr[i];
                }

                //printf("text_collapsed: %s\n", text_collapsed.c_str());
                //printf("regex_expr_collapsed: %s\n", regex_expr_collapsed.c_str());
                bpe_offsets = unicode_regex_split_stl(text_collapsed, regex_expr_collapsed, bpe_offsets);
            } else {
                // no unicode category used, we can use std::wregex directly
                const std::wstring wregex_expr = unicode_wstring_from_utf8(regex_expr);

                // std::wregex \s does not mach non-ASCII whitespaces, using 0x0B as fallback
                std::wstring wtext(cpts.begin(), cpts.end());
                for (size_t i = 0; i < wtext.size(); ++i) {
                    if (wtext[i] > 0x7F && unicode_cpt_flags_from_cpt(wtext[i]).is_whitespace) {
                        wtext[i] = 0x0B;
                    }
                }

                //printf("text: %s\n", text.c_str());
                //printf("regex_expr: %s\n", regex_expr.c_str());
                bpe_offsets = unicode_regex_split_stl(wtext, wregex_expr, bpe_offsets);
            }
        } catch (std::regex_error & e) {
            fprintf(stderr, "Failed to process regex: '%s'\n", regex_expr.c_str());
            fprintf(stderr, "Regex error: %s\n", e.what());
            throw std::runtime_error("Failed to process regex");
        }
    }

    std::vector<std::string> bpe_words;
    bpe_words.reserve(bpe_offsets.size()); // reserve memory for the approximate size

    size_t start = 0;
    for (size_t & offset : bpe_offsets) {
        bpe_words.emplace_back();
        for (size_t i = start; i < start + offset; ++i) {
            bpe_words.back() += unicode_cpt_to_utf8(cpts[i]);
        }
        start += offset;
    }

    return unicode_byte_encoding_process(bpe_words);
}